

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fDebugTests.cpp
# Opt level: O1

void deqp::gles31::Functional::anon_unknown_1::emitMessages
               (DebugMessageTestContext *ctx,GLenum source)

{
  uint type;
  GLuint id;
  long *plVar1;
  long *plVar2;
  long lVar3;
  string msg;
  long *local_b8;
  long local_b0;
  long local_a8;
  long lStack_a0;
  long *local_98;
  long local_90;
  long local_88;
  long lStack_80;
  long *local_78 [2];
  long local_68 [2];
  long *local_58;
  long local_50;
  long local_48;
  long lStack_40;
  long local_38;
  
  local_38 = 0;
  do {
    type = (&(anonymous_namespace)::s_debugTypes)[local_38];
    lVar3 = 0;
    do {
      id = *(GLuint *)((long)&(anonymous_namespace)::s_debugSeverities + lVar3);
      local_78[0] = local_68;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_78,"Application generated message with type ","");
      glu::getDebugMessageTypeName(type);
      plVar1 = (long *)std::__cxx11::string::append((char *)local_78);
      local_b8 = &local_a8;
      plVar2 = plVar1 + 2;
      if ((long *)*plVar1 == plVar2) {
        local_a8 = *plVar2;
        lStack_a0 = plVar1[3];
      }
      else {
        local_a8 = *plVar2;
        local_b8 = (long *)*plVar1;
      }
      local_b0 = plVar1[1];
      *plVar1 = (long)plVar2;
      plVar1[1] = 0;
      *(undefined1 *)(plVar1 + 2) = 0;
      plVar1 = (long *)std::__cxx11::string::append((char *)&local_b8);
      local_98 = &local_88;
      plVar2 = plVar1 + 2;
      if ((long *)*plVar1 == plVar2) {
        local_88 = *plVar2;
        lStack_80 = plVar1[3];
      }
      else {
        local_88 = *plVar2;
        local_98 = (long *)*plVar1;
      }
      local_90 = plVar1[1];
      *plVar1 = (long)plVar2;
      plVar1[1] = 0;
      *(undefined1 *)(plVar1 + 2) = 0;
      glu::getDebugMessageSeverityName(id);
      plVar1 = (long *)std::__cxx11::string::append((char *)&local_98);
      plVar2 = plVar1 + 2;
      if ((long *)*plVar1 == plVar2) {
        local_48 = *plVar2;
        lStack_40 = plVar1[3];
        local_58 = &local_48;
      }
      else {
        local_48 = *plVar2;
        local_58 = (long *)*plVar1;
      }
      local_50 = plVar1[1];
      *plVar1 = (long)plVar2;
      plVar1[1] = 0;
      *(undefined1 *)(plVar1 + 2) = 0;
      if (local_98 != &local_88) {
        operator_delete(local_98,local_88 + 1);
      }
      if (local_b8 != &local_a8) {
        operator_delete(local_b8,local_a8 + 1);
      }
      if (local_78[0] != local_68) {
        operator_delete(local_78[0],local_68[0] + 1);
      }
      glu::CallLogWrapper::glDebugMessageInsert
                ((CallLogWrapper *)ctx,source,type,id,id,-1,(GLchar *)local_58);
      (*(ctx->m_debugHost->super_ErrorCase).super_TestCase.super_TestCase.super_TestNode.
        _vptr_TestNode[6])(ctx->m_debugHost,source,(ulong)type);
      if (local_58 != &local_48) {
        operator_delete(local_58,local_48 + 1);
      }
      lVar3 = lVar3 + 4;
    } while (lVar3 != 0x10);
    local_38 = local_38 + 1;
  } while (local_38 != 9);
  return;
}

Assistant:

void emitMessages (DebugMessageTestContext& ctx, GLenum source)
{
	for (int typeNdx = 0; typeNdx < DE_LENGTH_OF_ARRAY(s_debugTypes); typeNdx++)
	{
		for (int severityNdx = 0; severityNdx < DE_LENGTH_OF_ARRAY(s_debugSeverities); severityNdx++)
		{
			const GLenum type		= s_debugTypes[typeNdx];
			const GLenum severity	= s_debugSeverities[severityNdx];
			const string msg		= string("Application generated message with type ") + glu::getDebugMessageTypeName(type)
									  + " and severity " + glu::getDebugMessageSeverityName(severity);

			// Use severity as ID, guaranteed unique
			ctx.glDebugMessageInsert(source, type, severity, severity, -1, msg.c_str());
			ctx.expectMessage(source, type);
		}
	}
}